

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void jsonnet::internal::lex_until_newline
               (char **c,string *text,uint *blanks,uint *indent,char **line_start,
               unsigned_long *line_number)

{
  bool bVar1;
  uint *indent_00;
  int *in_RDX;
  string *in_RSI;
  long *in_RDI;
  uint new_lines;
  char *last_non_space;
  char *original_c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar2;
  char **line_start_00;
  allocator *new_lines_00;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar3;
  int local_78;
  allocator local_61;
  string local_60 [32];
  long local_40;
  char **local_38;
  int *local_18;
  string *local_10;
  long *local_8;
  
  local_38 = (char **)*in_RDI;
  local_40 = *in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    uVar3 = false;
    if (*(char *)*local_8 != '\0') {
      uVar3 = *(char *)*local_8 != '\n';
    }
    if ((bool)uVar3 == false) break;
    bVar1 = is_horz_ws(*(char *)*local_8);
    if (!bVar1) {
      local_40 = *local_8;
    }
    *local_8 = *local_8 + 1;
  }
  indent_00 = (uint *)((local_40 - (long)local_38) + 1);
  new_lines_00 = &local_61;
  line_start_00 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,(char *)line_start_00,(ulong)indent_00,new_lines_00);
  std::__cxx11::string::operator=(local_10,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  lex_ws((char **)CONCAT17(uVar3,in_stack_ffffffffffffff80),(uint *)new_lines_00,indent_00,
         line_start_00,
         (unsigned_long *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (local_78 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = local_78 + -1;
  }
  *local_18 = iVar2;
  return;
}

Assistant:

static void lex_until_newline(const char *&c, std::string &text, unsigned &blanks, unsigned &indent,
                              const char *&line_start, unsigned long &line_number)
{
    const char *original_c = c;
    const char *last_non_space = c;
    for (; *c != '\0' && *c != '\n'; c++) {
        if (!is_horz_ws(*c))
            last_non_space = c;
    }
    text = std::string(original_c, last_non_space - original_c + 1);
    // Consume subsequent whitespace including the '\n'.
    unsigned new_lines;
    lex_ws(c, new_lines, indent, line_start, line_number);
    blanks = new_lines == 0 ? 0 : new_lines - 1;
}